

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selectLinkLayer.cpp
# Opt level: O1

EC_T_DWORD
CreateLinkParmsFromCmdLine
          (EC_T_CHAR **ptcWord,EC_T_CHAR **lpCmdLine,EC_T_CHAR *tcStorage,EC_T_BOOL *pbGetNextWord,
          EC_T_LINK_PARMS **ppLinkParms)

{
  byte bVar1;
  int iVar2;
  EC_T_DWORD EVar3;
  EC_T_BOOL EVar4;
  EC_T_LINK_PARMS *pEVar5;
  EC_T_LINK_PARMS **pbGetNextWord_00;
  EC_T_CHAR *tcStorage_00;
  EC_T_CHAR *tcStorage_01;
  EC_T_CHAR *tcStorage_02;
  EC_T_CHAR *tcStorage_03;
  EC_T_CHAR *tcStorage_04;
  EC_T_CHAR *tcStorage_05;
  EC_T_CHAR *tcStorage_06;
  EC_T_CHAR *tcStorage_07;
  EC_T_CHAR *tcStorage_08;
  EC_T_CHAR *tcStorage_09;
  EC_T_CHAR *tcStorage_10;
  EC_T_CHAR *tcStorage_11;
  EC_T_CHAR *tcStorage_12;
  EC_T_DWORD *pEVar6;
  EC_T_LINK_PARMS **ppLinkParms_00;
  
  ppLinkParms_00 = ppLinkParms;
  iVar2 = strcasecmp(*ptcWord,"-ccat");
  bVar1 = 1;
  if (iVar2 == 0) {
    pEVar5 = (EC_T_LINK_PARMS *)malloc(0x40);
    if (pEVar5 == (EC_T_LINK_PARMS *)0x0) {
      EVar3 = 0x9811000a;
      goto LAB_0014f441;
    }
    pEVar5->dwSignature = 0;
    pEVar5->dwSize = 0;
    pEVar5->szDriverIdent[0] = '\0';
    pEVar5->szDriverIdent[1] = '\0';
    pEVar5->szDriverIdent[2] = '\0';
    pEVar5->szDriverIdent[3] = '\0';
    pEVar5->szDriverIdent[4] = '\0';
    pEVar5->szDriverIdent[5] = '\0';
    pEVar5->szDriverIdent[6] = '\0';
    pEVar5->szDriverIdent[7] = '\0';
    pEVar5->szDriverIdent[8] = '\0';
    pEVar5->szDriverIdent[9] = '\0';
    pEVar5->szDriverIdent[10] = '\0';
    pEVar5->szDriverIdent[0xb] = '\0';
    pEVar5->szDriverIdent[0xc] = '\0';
    pEVar5->szDriverIdent[0xd] = '\0';
    pEVar5->szDriverIdent[0xe] = '\0';
    pEVar5->szDriverIdent[0xf] = '\0';
    pEVar5->szDriverIdent[0x10] = '\0';
    pEVar5->szDriverIdent[0x11] = '\0';
    pEVar5->szDriverIdent[0x12] = '\0';
    pEVar5->szDriverIdent[0x13] = '\0';
    pEVar5->szDriverIdent[0x14] = '\0';
    pEVar5->szDriverIdent[0x15] = '\0';
    pEVar5->szDriverIdent[0x16] = '\0';
    pEVar5->szDriverIdent[0x17] = '\0';
    pEVar5->szDriverIdent[0x18] = '\0';
    pEVar5->szDriverIdent[0x19] = '\0';
    pEVar5->szDriverIdent[0x1a] = '\0';
    pEVar5->szDriverIdent[0x1b] = '\0';
    pEVar5->szDriverIdent[0x1c] = '\0';
    pEVar5->szDriverIdent[0x1d] = '\0';
    pEVar5->szDriverIdent[0x1e] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x20] = '\0';
    pEVar5->szDriverIdent[0x21] = '\0';
    pEVar5->szDriverIdent[0x22] = '\0';
    pEVar5->szDriverIdent[0x23] = '\0';
    pEVar5->szDriverIdent[0x24] = '\0';
    pEVar5->szDriverIdent[0x25] = '\0';
    pEVar5->szDriverIdent[0x26] = '\0';
    pEVar5->szDriverIdent[0x27] = '\0';
    pEVar5->dwInstance = 0;
    pEVar5->eLinkMode = EcLinkMode_UNDEFINED;
    *(undefined8 *)&pEVar5->dwIstPriority = 0;
    pEVar6 = &pEVar5->dwInstance;
    pEVar5->dwSignature = 0xba12cab1;
    pEVar5->dwSize = 0x40;
    builtin_memcpy(pEVar5->szDriverIdent,"CCAT",5);
    pEVar5->szDriverIdent[5] = '\0';
    pEVar5->szDriverIdent[6] = '\0';
    pEVar5->szDriverIdent[7] = '\0';
    pEVar5->szDriverIdent[8] = '\0';
    pEVar5->szDriverIdent[9] = '\0';
    pEVar5->szDriverIdent[10] = '\0';
    pEVar5->szDriverIdent[0xb] = '\0';
    pEVar5->szDriverIdent[0xc] = '\0';
    pEVar5->szDriverIdent[0xd] = '\0';
    pEVar5->szDriverIdent[0xe] = '\0';
    pEVar5->szDriverIdent[0xf] = '\0';
    pEVar5->szDriverIdent[0x10] = '\0';
    pEVar5->szDriverIdent[0x11] = '\0';
    pEVar5->szDriverIdent[0x12] = '\0';
    pEVar5->szDriverIdent[0x13] = '\0';
    pEVar5->szDriverIdent[0x14] = '\0';
    pEVar5->szDriverIdent[0x15] = '\0';
    pEVar5->szDriverIdent[0x16] = '\0';
    pEVar5->szDriverIdent[0x17] = '\0';
    pEVar5->szDriverIdent[0x18] = '\0';
    pEVar5->szDriverIdent[0x19] = '\0';
    pEVar5->szDriverIdent[0x1a] = '\0';
    pEVar5->szDriverIdent[0x1b] = '\0';
    pEVar5->szDriverIdent[0x1c] = '\0';
    pEVar5->szDriverIdent[0x1d] = '\0';
    pEVar5->szDriverIdent[0x1e] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x20] = '\0';
    pEVar5->szDriverIdent[0x21] = '\0';
    pEVar5->szDriverIdent[0x22] = '\0';
    pEVar5->szDriverIdent[0x23] = '\0';
    pEVar5->szDriverIdent[0x24] = '\0';
    pEVar5->szDriverIdent[0x25] = '\0';
    pEVar5->szDriverIdent[0x26] = '\0';
    pEVar5->dwInstance = 1;
    pEVar5->eLinkMode = EcLinkMode_POLLING;
    pEVar5->dwIstPriority = 0;
    EVar4 = ParseDword(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_01,(EC_T_DWORD *)pbGetNextWord);
    EVar3 = 0x9811000b;
    if (EVar4 != 0) {
      pbGetNextWord = (EC_T_BOOL *)&pEVar5->eLinkMode;
      EVar4 = ParseLinkMode(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_02,(EC_T_LINKMODE *)pbGetNextWord
                           );
      if (EVar4 != 0) {
        *ppLinkParms = pEVar5;
        bVar1 = 0;
        EVar3 = 0;
      }
    }
  }
  else {
    EVar3 = 0x9811000c;
LAB_0014f441:
    pEVar5 = (EC_T_LINK_PARMS *)0x0;
  }
  if (!(bool)(bVar1 ^ 1 | pEVar5 == (EC_T_LINK_PARMS *)0x0)) {
    free(pEVar5);
  }
  if (iVar2 == 0) {
    return EVar3;
  }
  iVar2 = strcasecmp(*ptcWord,"-eg20t");
  bVar1 = 1;
  if (iVar2 == 0) {
    pEVar5 = (EC_T_LINK_PARMS *)malloc(0x40);
    if (pEVar5 == (EC_T_LINK_PARMS *)0x0) {
      EVar3 = 0x9811000a;
      goto LAB_0014f486;
    }
    pEVar5->dwSignature = 0;
    pEVar5->dwSize = 0;
    pEVar5->szDriverIdent[0] = '\0';
    pEVar5->szDriverIdent[1] = '\0';
    pEVar5->szDriverIdent[2] = '\0';
    pEVar5->szDriverIdent[3] = '\0';
    pEVar5->szDriverIdent[4] = '\0';
    pEVar5->szDriverIdent[5] = '\0';
    pEVar5->szDriverIdent[6] = '\0';
    pEVar5->szDriverIdent[7] = '\0';
    pEVar5->szDriverIdent[8] = '\0';
    pEVar5->szDriverIdent[9] = '\0';
    pEVar5->szDriverIdent[10] = '\0';
    pEVar5->szDriverIdent[0xb] = '\0';
    pEVar5->szDriverIdent[0xc] = '\0';
    pEVar5->szDriverIdent[0xd] = '\0';
    pEVar5->szDriverIdent[0xe] = '\0';
    pEVar5->szDriverIdent[0xf] = '\0';
    pEVar5->szDriverIdent[0x10] = '\0';
    pEVar5->szDriverIdent[0x11] = '\0';
    pEVar5->szDriverIdent[0x12] = '\0';
    pEVar5->szDriverIdent[0x13] = '\0';
    pEVar5->szDriverIdent[0x14] = '\0';
    pEVar5->szDriverIdent[0x15] = '\0';
    pEVar5->szDriverIdent[0x16] = '\0';
    pEVar5->szDriverIdent[0x17] = '\0';
    pEVar5->szDriverIdent[0x18] = '\0';
    pEVar5->szDriverIdent[0x19] = '\0';
    pEVar5->szDriverIdent[0x1a] = '\0';
    pEVar5->szDriverIdent[0x1b] = '\0';
    pEVar5->szDriverIdent[0x1c] = '\0';
    pEVar5->szDriverIdent[0x1d] = '\0';
    pEVar5->szDriverIdent[0x1e] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x20] = '\0';
    pEVar5->szDriverIdent[0x21] = '\0';
    pEVar5->szDriverIdent[0x22] = '\0';
    pEVar5->szDriverIdent[0x23] = '\0';
    pEVar5->szDriverIdent[0x24] = '\0';
    pEVar5->szDriverIdent[0x25] = '\0';
    pEVar5->szDriverIdent[0x26] = '\0';
    pEVar5->szDriverIdent[0x27] = '\0';
    pEVar5->dwInstance = 0;
    pEVar5->eLinkMode = EcLinkMode_UNDEFINED;
    *(undefined8 *)&pEVar5->dwIstPriority = 0;
    pEVar6 = &pEVar5->dwInstance;
    pEVar5->dwSignature = 0xba12cb01;
    pEVar5->dwSize = 0x40;
    builtin_memcpy(pEVar5->szDriverIdent,"EG20T",6);
    pEVar5->szDriverIdent[6] = '\0';
    pEVar5->szDriverIdent[7] = '\0';
    pEVar5->szDriverIdent[8] = '\0';
    pEVar5->szDriverIdent[9] = '\0';
    pEVar5->szDriverIdent[10] = '\0';
    pEVar5->szDriverIdent[0xb] = '\0';
    pEVar5->szDriverIdent[0xc] = '\0';
    pEVar5->szDriverIdent[0xd] = '\0';
    pEVar5->szDriverIdent[0xe] = '\0';
    pEVar5->szDriverIdent[0xf] = '\0';
    pEVar5->szDriverIdent[0x10] = '\0';
    pEVar5->szDriverIdent[0x11] = '\0';
    pEVar5->szDriverIdent[0x12] = '\0';
    pEVar5->szDriverIdent[0x13] = '\0';
    pEVar5->szDriverIdent[0x14] = '\0';
    pEVar5->szDriverIdent[0x15] = '\0';
    pEVar5->szDriverIdent[0x16] = '\0';
    pEVar5->szDriverIdent[0x17] = '\0';
    pEVar5->szDriverIdent[0x18] = '\0';
    pEVar5->szDriverIdent[0x19] = '\0';
    pEVar5->szDriverIdent[0x1a] = '\0';
    pEVar5->szDriverIdent[0x1b] = '\0';
    pEVar5->szDriverIdent[0x1c] = '\0';
    pEVar5->szDriverIdent[0x1d] = '\0';
    pEVar5->szDriverIdent[0x1e] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x20] = '\0';
    pEVar5->szDriverIdent[0x21] = '\0';
    pEVar5->szDriverIdent[0x22] = '\0';
    pEVar5->szDriverIdent[0x23] = '\0';
    pEVar5->szDriverIdent[0x24] = '\0';
    pEVar5->szDriverIdent[0x25] = '\0';
    pEVar5->szDriverIdent[0x26] = '\0';
    pEVar5->dwInstance = 1;
    pEVar5->eLinkMode = EcLinkMode_POLLING;
    pEVar5->dwIstPriority = 0;
    EVar4 = ParseDword(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_03,(EC_T_DWORD *)pbGetNextWord);
    EVar3 = 0x9811000b;
    if (EVar4 != 0) {
      pbGetNextWord = (EC_T_BOOL *)&pEVar5->eLinkMode;
      EVar4 = ParseLinkMode(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_04,(EC_T_LINKMODE *)pbGetNextWord
                           );
      if (EVar4 != 0) {
        *ppLinkParms = pEVar5;
        bVar1 = 0;
        EVar3 = 0;
      }
    }
  }
  else {
    EVar3 = 0x9811000c;
LAB_0014f486:
    pEVar5 = (EC_T_LINK_PARMS *)0x0;
  }
  if (!(bool)(bVar1 ^ 1 | pEVar5 == (EC_T_LINK_PARMS *)0x0)) {
    free(pEVar5);
  }
  if (iVar2 == 0) {
    return EVar3;
  }
  iVar2 = strcasecmp(*ptcWord,"-i8254x");
  bVar1 = 1;
  if (iVar2 == 0) {
    pEVar5 = (EC_T_LINK_PARMS *)malloc(0x50);
    if (pEVar5 == (EC_T_LINK_PARMS *)0x0) {
      EVar3 = 0x9811000a;
      goto LAB_0014f4cb;
    }
    pEVar5->dwSignature = 0;
    pEVar5->dwSize = 0;
    pEVar5->szDriverIdent[0] = '\0';
    pEVar5->szDriverIdent[1] = '\0';
    pEVar5->szDriverIdent[2] = '\0';
    pEVar5->szDriverIdent[3] = '\0';
    pEVar5->szDriverIdent[4] = '\0';
    pEVar5->szDriverIdent[5] = '\0';
    pEVar5->szDriverIdent[6] = '\0';
    pEVar5->szDriverIdent[7] = '\0';
    pEVar5->szDriverIdent[8] = '\0';
    pEVar5->szDriverIdent[9] = '\0';
    pEVar5->szDriverIdent[10] = '\0';
    pEVar5->szDriverIdent[0xb] = '\0';
    pEVar5->szDriverIdent[0xc] = '\0';
    pEVar5->szDriverIdent[0xd] = '\0';
    pEVar5->szDriverIdent[0xe] = '\0';
    pEVar5->szDriverIdent[0xf] = '\0';
    pEVar5->szDriverIdent[0x10] = '\0';
    pEVar5->szDriverIdent[0x11] = '\0';
    pEVar5->szDriverIdent[0x12] = '\0';
    pEVar5->szDriverIdent[0x13] = '\0';
    pEVar5->szDriverIdent[0x14] = '\0';
    pEVar5->szDriverIdent[0x15] = '\0';
    pEVar5->szDriverIdent[0x16] = '\0';
    pEVar5->szDriverIdent[0x17] = '\0';
    pEVar5->szDriverIdent[0x18] = '\0';
    pEVar5->szDriverIdent[0x19] = '\0';
    pEVar5->szDriverIdent[0x1a] = '\0';
    pEVar5->szDriverIdent[0x1b] = '\0';
    pEVar5->szDriverIdent[0x1c] = '\0';
    pEVar5->szDriverIdent[0x1d] = '\0';
    pEVar5->szDriverIdent[0x1e] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x20] = '\0';
    pEVar5->szDriverIdent[0x21] = '\0';
    pEVar5->szDriverIdent[0x22] = '\0';
    pEVar5->szDriverIdent[0x23] = '\0';
    pEVar5->szDriverIdent[0x24] = '\0';
    pEVar5->szDriverIdent[0x25] = '\0';
    pEVar5->szDriverIdent[0x26] = '\0';
    pEVar5->szDriverIdent[0x27] = '\0';
    pEVar5->dwInstance = 0;
    pEVar5->eLinkMode = EcLinkMode_UNDEFINED;
    *(undefined8 *)&pEVar5->dwIstPriority = 0;
    pEVar5[1].dwSignature = 0;
    pEVar5[1].dwSize = 0;
    pEVar5[1].szDriverIdent[0] = '\0';
    pEVar5[1].szDriverIdent[1] = '\0';
    pEVar5[1].szDriverIdent[2] = '\0';
    pEVar5[1].szDriverIdent[3] = '\0';
    pEVar5[1].szDriverIdent[4] = '\0';
    pEVar5[1].szDriverIdent[5] = '\0';
    pEVar5[1].szDriverIdent[6] = '\0';
    pEVar5[1].szDriverIdent[7] = '\0';
    pEVar6 = &pEVar5->dwInstance;
    pEVar5->dwSignature = 0xba12ca31;
    pEVar5->dwSize = 0x50;
    builtin_memcpy(pEVar5->szDriverIdent,"I8254x",7);
    pEVar5->szDriverIdent[7] = '\0';
    pEVar5->szDriverIdent[8] = '\0';
    pEVar5->szDriverIdent[9] = '\0';
    pEVar5->szDriverIdent[10] = '\0';
    pEVar5->szDriverIdent[0xb] = '\0';
    pEVar5->szDriverIdent[0xc] = '\0';
    pEVar5->szDriverIdent[0xd] = '\0';
    pEVar5->szDriverIdent[0xe] = '\0';
    pEVar5->szDriverIdent[0xf] = '\0';
    pEVar5->szDriverIdent[0x10] = '\0';
    pEVar5->szDriverIdent[0x11] = '\0';
    pEVar5->szDriverIdent[0x12] = '\0';
    pEVar5->szDriverIdent[0x13] = '\0';
    pEVar5->szDriverIdent[0x14] = '\0';
    pEVar5->szDriverIdent[0x15] = '\0';
    pEVar5->szDriverIdent[0x16] = '\0';
    pEVar5->szDriverIdent[0x17] = '\0';
    pEVar5->szDriverIdent[0x18] = '\0';
    pEVar5->szDriverIdent[0x19] = '\0';
    pEVar5->szDriverIdent[0x1a] = '\0';
    pEVar5->szDriverIdent[0x1b] = '\0';
    pEVar5->szDriverIdent[0x1c] = '\0';
    pEVar5->szDriverIdent[0x1d] = '\0';
    pEVar5->szDriverIdent[0x1e] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x20] = '\0';
    pEVar5->szDriverIdent[0x21] = '\0';
    pEVar5->szDriverIdent[0x22] = '\0';
    pEVar5->szDriverIdent[0x23] = '\0';
    pEVar5->szDriverIdent[0x24] = '\0';
    pEVar5->szDriverIdent[0x25] = '\0';
    pEVar5->szDriverIdent[0x26] = '\0';
    pEVar5->dwInstance = 1;
    pEVar5->eLinkMode = EcLinkMode_POLLING;
    pEVar5->dwIstPriority = 0;
    EVar4 = ParseDword(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_05,(EC_T_DWORD *)pbGetNextWord);
    EVar3 = 0x9811000b;
    if (EVar4 != 0) {
      pbGetNextWord = (EC_T_BOOL *)&pEVar5->eLinkMode;
      EVar4 = ParseLinkMode(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_06,(EC_T_LINKMODE *)pbGetNextWord
                           );
      if (EVar4 != 0) {
        *ppLinkParms = pEVar5;
        bVar1 = 0;
        EVar3 = 0;
      }
    }
  }
  else {
    EVar3 = 0x9811000c;
LAB_0014f4cb:
    pEVar5 = (EC_T_LINK_PARMS *)0x0;
  }
  if (!(bool)(bVar1 ^ 1 | pEVar5 == (EC_T_LINK_PARMS *)0x0)) {
    free(pEVar5);
  }
  if (iVar2 == 0) {
    return EVar3;
  }
  iVar2 = strcasecmp(*ptcWord,"-i8255x");
  bVar1 = 1;
  if (iVar2 == 0) {
    pEVar5 = (EC_T_LINK_PARMS *)malloc(0x40);
    if (pEVar5 == (EC_T_LINK_PARMS *)0x0) {
      EVar3 = 0x9811000a;
      goto LAB_0014f510;
    }
    pEVar5->dwSignature = 0;
    pEVar5->dwSize = 0;
    pEVar5->szDriverIdent[0] = '\0';
    pEVar5->szDriverIdent[1] = '\0';
    pEVar5->szDriverIdent[2] = '\0';
    pEVar5->szDriverIdent[3] = '\0';
    pEVar5->szDriverIdent[4] = '\0';
    pEVar5->szDriverIdent[5] = '\0';
    pEVar5->szDriverIdent[6] = '\0';
    pEVar5->szDriverIdent[7] = '\0';
    pEVar5->szDriverIdent[8] = '\0';
    pEVar5->szDriverIdent[9] = '\0';
    pEVar5->szDriverIdent[10] = '\0';
    pEVar5->szDriverIdent[0xb] = '\0';
    pEVar5->szDriverIdent[0xc] = '\0';
    pEVar5->szDriverIdent[0xd] = '\0';
    pEVar5->szDriverIdent[0xe] = '\0';
    pEVar5->szDriverIdent[0xf] = '\0';
    pEVar5->szDriverIdent[0x10] = '\0';
    pEVar5->szDriverIdent[0x11] = '\0';
    pEVar5->szDriverIdent[0x12] = '\0';
    pEVar5->szDriverIdent[0x13] = '\0';
    pEVar5->szDriverIdent[0x14] = '\0';
    pEVar5->szDriverIdent[0x15] = '\0';
    pEVar5->szDriverIdent[0x16] = '\0';
    pEVar5->szDriverIdent[0x17] = '\0';
    pEVar5->szDriverIdent[0x18] = '\0';
    pEVar5->szDriverIdent[0x19] = '\0';
    pEVar5->szDriverIdent[0x1a] = '\0';
    pEVar5->szDriverIdent[0x1b] = '\0';
    pEVar5->szDriverIdent[0x1c] = '\0';
    pEVar5->szDriverIdent[0x1d] = '\0';
    pEVar5->szDriverIdent[0x1e] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x20] = '\0';
    pEVar5->szDriverIdent[0x21] = '\0';
    pEVar5->szDriverIdent[0x22] = '\0';
    pEVar5->szDriverIdent[0x23] = '\0';
    pEVar5->szDriverIdent[0x24] = '\0';
    pEVar5->szDriverIdent[0x25] = '\0';
    pEVar5->szDriverIdent[0x26] = '\0';
    pEVar5->szDriverIdent[0x27] = '\0';
    pEVar5->dwInstance = 0;
    pEVar5->eLinkMode = EcLinkMode_UNDEFINED;
    *(undefined8 *)&pEVar5->dwIstPriority = 0;
    pEVar6 = &pEVar5->dwInstance;
    pEVar5->dwSignature = 0xba12ca21;
    pEVar5->dwSize = 0x40;
    builtin_memcpy(pEVar5->szDriverIdent,"I8255x",7);
    pEVar5->szDriverIdent[7] = '\0';
    pEVar5->szDriverIdent[8] = '\0';
    pEVar5->szDriverIdent[9] = '\0';
    pEVar5->szDriverIdent[10] = '\0';
    pEVar5->szDriverIdent[0xb] = '\0';
    pEVar5->szDriverIdent[0xc] = '\0';
    pEVar5->szDriverIdent[0xd] = '\0';
    pEVar5->szDriverIdent[0xe] = '\0';
    pEVar5->szDriverIdent[0xf] = '\0';
    pEVar5->szDriverIdent[0x10] = '\0';
    pEVar5->szDriverIdent[0x11] = '\0';
    pEVar5->szDriverIdent[0x12] = '\0';
    pEVar5->szDriverIdent[0x13] = '\0';
    pEVar5->szDriverIdent[0x14] = '\0';
    pEVar5->szDriverIdent[0x15] = '\0';
    pEVar5->szDriverIdent[0x16] = '\0';
    pEVar5->szDriverIdent[0x17] = '\0';
    pEVar5->szDriverIdent[0x18] = '\0';
    pEVar5->szDriverIdent[0x19] = '\0';
    pEVar5->szDriverIdent[0x1a] = '\0';
    pEVar5->szDriverIdent[0x1b] = '\0';
    pEVar5->szDriverIdent[0x1c] = '\0';
    pEVar5->szDriverIdent[0x1d] = '\0';
    pEVar5->szDriverIdent[0x1e] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x20] = '\0';
    pEVar5->szDriverIdent[0x21] = '\0';
    pEVar5->szDriverIdent[0x22] = '\0';
    pEVar5->szDriverIdent[0x23] = '\0';
    pEVar5->szDriverIdent[0x24] = '\0';
    pEVar5->szDriverIdent[0x25] = '\0';
    pEVar5->szDriverIdent[0x26] = '\0';
    pEVar5->dwInstance = 1;
    pEVar5->eLinkMode = EcLinkMode_POLLING;
    pEVar5->dwIstPriority = 0;
    EVar4 = ParseDword(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_07,(EC_T_DWORD *)pbGetNextWord);
    EVar3 = 0x9811000b;
    if (EVar4 != 0) {
      pbGetNextWord = (EC_T_BOOL *)&pEVar5->eLinkMode;
      EVar4 = ParseLinkMode(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_08,(EC_T_LINKMODE *)pbGetNextWord
                           );
      if (EVar4 != 0) {
        *ppLinkParms = pEVar5;
        bVar1 = 0;
        EVar3 = 0;
      }
    }
  }
  else {
    EVar3 = 0x9811000c;
LAB_0014f510:
    pEVar5 = (EC_T_LINK_PARMS *)0x0;
  }
  if (!(bool)(bVar1 ^ 1 | pEVar5 == (EC_T_LINK_PARMS *)0x0)) {
    free(pEVar5);
  }
  if (iVar2 == 0) {
    return EVar3;
  }
  iVar2 = strcasecmp(*ptcWord,"-r6040");
  bVar1 = 1;
  if (iVar2 == 0) {
    pEVar5 = (EC_T_LINK_PARMS *)malloc(0x40);
    if (pEVar5 == (EC_T_LINK_PARMS *)0x0) {
      EVar3 = 0x9811000a;
      goto LAB_0014f555;
    }
    pEVar5->dwSignature = 0;
    pEVar5->dwSize = 0;
    pEVar5->szDriverIdent[0] = '\0';
    pEVar5->szDriverIdent[1] = '\0';
    pEVar5->szDriverIdent[2] = '\0';
    pEVar5->szDriverIdent[3] = '\0';
    pEVar5->szDriverIdent[4] = '\0';
    pEVar5->szDriverIdent[5] = '\0';
    pEVar5->szDriverIdent[6] = '\0';
    pEVar5->szDriverIdent[7] = '\0';
    pEVar5->szDriverIdent[8] = '\0';
    pEVar5->szDriverIdent[9] = '\0';
    pEVar5->szDriverIdent[10] = '\0';
    pEVar5->szDriverIdent[0xb] = '\0';
    pEVar5->szDriverIdent[0xc] = '\0';
    pEVar5->szDriverIdent[0xd] = '\0';
    pEVar5->szDriverIdent[0xe] = '\0';
    pEVar5->szDriverIdent[0xf] = '\0';
    pEVar5->szDriverIdent[0x10] = '\0';
    pEVar5->szDriverIdent[0x11] = '\0';
    pEVar5->szDriverIdent[0x12] = '\0';
    pEVar5->szDriverIdent[0x13] = '\0';
    pEVar5->szDriverIdent[0x14] = '\0';
    pEVar5->szDriverIdent[0x15] = '\0';
    pEVar5->szDriverIdent[0x16] = '\0';
    pEVar5->szDriverIdent[0x17] = '\0';
    pEVar5->szDriverIdent[0x18] = '\0';
    pEVar5->szDriverIdent[0x19] = '\0';
    pEVar5->szDriverIdent[0x1a] = '\0';
    pEVar5->szDriverIdent[0x1b] = '\0';
    pEVar5->szDriverIdent[0x1c] = '\0';
    pEVar5->szDriverIdent[0x1d] = '\0';
    pEVar5->szDriverIdent[0x1e] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x20] = '\0';
    pEVar5->szDriverIdent[0x21] = '\0';
    pEVar5->szDriverIdent[0x22] = '\0';
    pEVar5->szDriverIdent[0x23] = '\0';
    pEVar5->szDriverIdent[0x24] = '\0';
    pEVar5->szDriverIdent[0x25] = '\0';
    pEVar5->szDriverIdent[0x26] = '\0';
    pEVar5->szDriverIdent[0x27] = '\0';
    pEVar5->dwInstance = 0;
    pEVar5->eLinkMode = EcLinkMode_UNDEFINED;
    *(undefined8 *)&pEVar5->dwIstPriority = 0;
    pEVar6 = &pEVar5->dwInstance;
    pEVar5->dwSignature = 0xba12cb11;
    pEVar5->dwSize = 0x40;
    builtin_memcpy(pEVar5->szDriverIdent,"R6040",6);
    pEVar5->szDriverIdent[6] = '\0';
    pEVar5->szDriverIdent[7] = '\0';
    pEVar5->szDriverIdent[8] = '\0';
    pEVar5->szDriverIdent[9] = '\0';
    pEVar5->szDriverIdent[10] = '\0';
    pEVar5->szDriverIdent[0xb] = '\0';
    pEVar5->szDriverIdent[0xc] = '\0';
    pEVar5->szDriverIdent[0xd] = '\0';
    pEVar5->szDriverIdent[0xe] = '\0';
    pEVar5->szDriverIdent[0xf] = '\0';
    pEVar5->szDriverIdent[0x10] = '\0';
    pEVar5->szDriverIdent[0x11] = '\0';
    pEVar5->szDriverIdent[0x12] = '\0';
    pEVar5->szDriverIdent[0x13] = '\0';
    pEVar5->szDriverIdent[0x14] = '\0';
    pEVar5->szDriverIdent[0x15] = '\0';
    pEVar5->szDriverIdent[0x16] = '\0';
    pEVar5->szDriverIdent[0x17] = '\0';
    pEVar5->szDriverIdent[0x18] = '\0';
    pEVar5->szDriverIdent[0x19] = '\0';
    pEVar5->szDriverIdent[0x1a] = '\0';
    pEVar5->szDriverIdent[0x1b] = '\0';
    pEVar5->szDriverIdent[0x1c] = '\0';
    pEVar5->szDriverIdent[0x1d] = '\0';
    pEVar5->szDriverIdent[0x1e] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x1f] = '\0';
    pEVar5->szDriverIdent[0x20] = '\0';
    pEVar5->szDriverIdent[0x21] = '\0';
    pEVar5->szDriverIdent[0x22] = '\0';
    pEVar5->szDriverIdent[0x23] = '\0';
    pEVar5->szDriverIdent[0x24] = '\0';
    pEVar5->szDriverIdent[0x25] = '\0';
    pEVar5->szDriverIdent[0x26] = '\0';
    pEVar5->dwInstance = 1;
    pEVar5->eLinkMode = EcLinkMode_POLLING;
    pEVar5->dwIstPriority = 0;
    EVar4 = ParseDword(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_09,(EC_T_DWORD *)pbGetNextWord);
    EVar3 = 0x9811000b;
    if ((EVar4 != 0) &&
       (EVar4 = ParseLinkMode(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_10,&pEVar5->eLinkMode),
       EVar4 != 0)) {
      *ppLinkParms = pEVar5;
      bVar1 = 0;
      EVar3 = 0;
    }
  }
  else {
    EVar3 = 0x9811000c;
LAB_0014f555:
    pEVar5 = (EC_T_LINK_PARMS *)0x0;
  }
  if (!(bool)(bVar1 ^ 1 | pEVar5 == (EC_T_LINK_PARMS *)0x0)) {
    free(pEVar5);
  }
  if (iVar2 == 0) {
    return EVar3;
  }
  iVar2 = strcasecmp(*ptcWord,"-rtl8139");
  bVar1 = 1;
  if (iVar2 == 0) {
    pEVar5 = (EC_T_LINK_PARMS *)malloc(0x48);
    if (pEVar5 != (EC_T_LINK_PARMS *)0x0) {
      pEVar5->dwSignature = 0;
      pEVar5->dwSize = 0;
      pEVar5->szDriverIdent[0] = '\0';
      pEVar5->szDriverIdent[1] = '\0';
      pEVar5->szDriverIdent[2] = '\0';
      pEVar5->szDriverIdent[3] = '\0';
      pEVar5->szDriverIdent[4] = '\0';
      pEVar5->szDriverIdent[5] = '\0';
      pEVar5->szDriverIdent[6] = '\0';
      pEVar5->szDriverIdent[7] = '\0';
      pEVar5->szDriverIdent[8] = '\0';
      pEVar5->szDriverIdent[9] = '\0';
      pEVar5->szDriverIdent[10] = '\0';
      pEVar5->szDriverIdent[0xb] = '\0';
      pEVar5->szDriverIdent[0xc] = '\0';
      pEVar5->szDriverIdent[0xd] = '\0';
      pEVar5->szDriverIdent[0xe] = '\0';
      pEVar5->szDriverIdent[0xf] = '\0';
      pEVar5->szDriverIdent[0x10] = '\0';
      pEVar5->szDriverIdent[0x11] = '\0';
      pEVar5->szDriverIdent[0x12] = '\0';
      pEVar5->szDriverIdent[0x13] = '\0';
      pEVar5->szDriverIdent[0x14] = '\0';
      pEVar5->szDriverIdent[0x15] = '\0';
      pEVar5->szDriverIdent[0x16] = '\0';
      pEVar5->szDriverIdent[0x17] = '\0';
      pEVar5->szDriverIdent[0x18] = '\0';
      pEVar5->szDriverIdent[0x19] = '\0';
      pEVar5->szDriverIdent[0x1a] = '\0';
      pEVar5->szDriverIdent[0x1b] = '\0';
      pEVar5->szDriverIdent[0x1c] = '\0';
      pEVar5->szDriverIdent[0x1d] = '\0';
      pEVar5->szDriverIdent[0x1e] = '\0';
      pEVar5->szDriverIdent[0x1f] = '\0';
      pEVar5->szDriverIdent[0x20] = '\0';
      pEVar5->szDriverIdent[0x21] = '\0';
      pEVar5->szDriverIdent[0x22] = '\0';
      pEVar5->szDriverIdent[0x23] = '\0';
      pEVar5->szDriverIdent[0x24] = '\0';
      pEVar5->szDriverIdent[0x25] = '\0';
      pEVar5->szDriverIdent[0x26] = '\0';
      pEVar5->szDriverIdent[0x27] = '\0';
      pEVar5->dwInstance = 0;
      pEVar5->eLinkMode = EcLinkMode_UNDEFINED;
      *(undefined8 *)&pEVar5->dwIstPriority = 0;
      pEVar5[1].dwSignature = 0;
      pEVar5[1].dwSize = 0;
      pEVar6 = &pEVar5->dwInstance;
      pEVar5->dwSignature = 0xba12ca41;
      pEVar5->dwSize = 0x48;
      builtin_memcpy(pEVar5->szDriverIdent,"RTL8139",8);
      pEVar5->szDriverIdent[8] = '\0';
      pEVar5->szDriverIdent[9] = '\0';
      pEVar5->szDriverIdent[10] = '\0';
      pEVar5->szDriverIdent[0xb] = '\0';
      pEVar5->szDriverIdent[0xc] = '\0';
      pEVar5->szDriverIdent[0xd] = '\0';
      pEVar5->szDriverIdent[0xe] = '\0';
      pEVar5->szDriverIdent[0xf] = '\0';
      pEVar5->szDriverIdent[0x10] = '\0';
      pEVar5->szDriverIdent[0x11] = '\0';
      pEVar5->szDriverIdent[0x12] = '\0';
      pEVar5->szDriverIdent[0x13] = '\0';
      pEVar5->szDriverIdent[0x14] = '\0';
      pEVar5->szDriverIdent[0x15] = '\0';
      pEVar5->szDriverIdent[0x16] = '\0';
      pEVar5->szDriverIdent[0x17] = '\0';
      pEVar5->szDriverIdent[0x18] = '\0';
      pEVar5->szDriverIdent[0x19] = '\0';
      pEVar5->szDriverIdent[0x1a] = '\0';
      pEVar5->szDriverIdent[0x1b] = '\0';
      pEVar5->szDriverIdent[0x1c] = '\0';
      pEVar5->szDriverIdent[0x1d] = '\0';
      pEVar5->szDriverIdent[0x1e] = '\0';
      pEVar5->szDriverIdent[0x1f] = '\0';
      pEVar5->szDriverIdent[0x1f] = '\0';
      pEVar5->szDriverIdent[0x20] = '\0';
      pEVar5->szDriverIdent[0x21] = '\0';
      pEVar5->szDriverIdent[0x22] = '\0';
      pEVar5->szDriverIdent[0x23] = '\0';
      pEVar5->szDriverIdent[0x24] = '\0';
      pEVar5->szDriverIdent[0x25] = '\0';
      pEVar5->szDriverIdent[0x26] = '\0';
      pEVar5->dwInstance = 1;
      pEVar5->eLinkMode = EcLinkMode_POLLING;
      pEVar5->dwIstPriority = 0;
      EVar4 = ParseDword(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_11,(EC_T_DWORD *)0x48ba12ca41);
      EVar3 = 0x9811000b;
      if ((EVar4 != 0) &&
         (EVar4 = ParseLinkMode(ptcWord,(EC_T_CHAR **)pEVar6,tcStorage_12,&pEVar5->eLinkMode),
         EVar4 != 0)) {
        *ppLinkParms = pEVar5;
        bVar1 = 0;
        EVar3 = 0;
      }
      goto LAB_0014f599;
    }
    EVar3 = 0x9811000a;
  }
  else {
    EVar3 = 0x9811000c;
  }
  pEVar5 = (EC_T_LINK_PARMS *)0x0;
LAB_0014f599:
  if (!(bool)(bVar1 ^ 1 | pEVar5 == (EC_T_LINK_PARMS *)0x0)) {
    free(pEVar5);
  }
  if ((iVar2 != 0) &&
     (pbGetNextWord_00 = ppLinkParms,
     EVar3 = CreateLinkParmsFromCmdLineRTL8169
                       (ptcWord,lpCmdLine,tcStorage,(EC_T_BOOL *)ppLinkParms,ppLinkParms_00),
     EVar3 == 0x9811000c)) {
    EVar3 = CreateLinkParmsFromCmdLineSockRaw
                      (ptcWord,(EC_T_CHAR **)ppLinkParms,tcStorage_00,(EC_T_BOOL *)pbGetNextWord_00,
                       ppLinkParms_00);
    return EVar3;
  }
  return EVar3;
}

Assistant:

EC_T_DWORD CreateLinkParmsFromCmdLine
(   EC_T_CHAR**     ptcWord,
    EC_T_CHAR**     lpCmdLine,
    EC_T_CHAR*      tcStorage,
    EC_T_BOOL*      pbGetNextWord,  /* [out]  Shows that next parameter should be read or not */
    EC_T_LINK_PARMS** ppLinkParms
)
{
EC_T_DWORD dwRetVal = EC_E_NOTFOUND;

#if (defined INCLUDE_CCAT)
    dwRetVal = CreateLinkParmsFromCmdLineCCAT(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_EG20T)
    dwRetVal = CreateLinkParmsFromCmdLineEG20T(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_CPSW)
    dwRetVal = CreateLinkParmsFromCmdLineCPSW(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_EMAC)
    dwRetVal = CreateLinkParmsFromCmdLineEMAC(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_ETSEC)
    dwRetVal = CreateLinkParmsFromCmdLineETSEC(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_FSLFEC)
    dwRetVal = CreateLinkParmsFromCmdLineFslFec(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_GEM)
    dwRetVal = CreateLinkParmsFromCmdLineGEM(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_I8254X)
    dwRetVal = CreateLinkParmsFromCmdLineI8254x(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_I8255X)
    dwRetVal = CreateLinkParmsFromCmdLineI8255x(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_ICSS)
    dwRetVal = CreateLinkParmsFromCmdLineICSS(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_L9218I)
    dwRetVal = CreateLinkParmsFromCmdLineL9218i(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_NDISUIO)
    dwRetVal = CreateLinkParmsFromCmdLineNDISUIO(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_PXAMFU)
    dwRetVal = CreateLinkParmsFromCmdLinePXAMFU(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_R6040)
    dwRetVal = CreateLinkParmsFromCmdLineR6040(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined EC_VERSION_RIN32M3)
    dwRetVal = CreateLinkParmsFromCmdLineRIN32M3(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_RTL8139)
    dwRetVal = CreateLinkParmsFromCmdLineRTL8139(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_RTL8169)
    dwRetVal = CreateLinkParmsFromCmdLineRTL8169(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined EC_VERSION_RZT1)
    dwRetVal = CreateLinkParmsFromCmdLineRZT1(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_SNARF)
    dwRetVal = CreateLinkParmsFromCmdLineSnarf(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_SHETH)
    dwRetVal = CreateLinkParmsFromCmdLineSHEth(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_SOCKRAW)
    dwRetVal = CreateLinkParmsFromCmdLineSockRaw(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_WINPCAP)
    dwRetVal = CreateLinkParmsFromCmdLineWinPcap(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_DW3504)
    dwRetVal = CreateLinkParmsFromCmdLineDW3504(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_DUMMY)
    dwRetVal = CreateLinkParmsFromCmdLineDummy(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
Exit:
    return dwRetVal;
}